

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

void opj_jp2_apply_cdef(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *manager)

{
  ushort uVar1;
  opj_jp2_cdef_info_t *poVar2;
  opj_image_comp_t *poVar3;
  opj_image_comp_t *poVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  OPJ_INT32 *pOVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  OPJ_INT32 *pOVar11;
  undefined8 uVar12;
  opj_image_comp_t *poVar13;
  ulong uVar14;
  OPJ_UINT32 OVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  OPJ_UINT32 OVar23;
  OPJ_UINT32 OVar24;
  OPJ_UINT32 OVar25;
  OPJ_UINT32 OVar26;
  OPJ_UINT32 OVar27;
  OPJ_UINT32 OVar28;
  OPJ_UINT32 OVar29;
  opj_jp2_cdef_info_t *poVar30;
  char *fmt;
  opj_jp2_cdef_info_t *poVar31;
  ulong uVar32;
  ushort uVar33;
  ulong uVar34;
  ushort uVar35;
  ulong uVar36;
  ulong uVar37;
  opj_image_comp_t saved;
  
  uVar32 = (ulong)color->jp2_cdef->n;
  if (uVar32 != 0) {
    poVar2 = color->jp2_cdef->info;
    uVar36 = 1;
    uVar37 = 0;
    poVar31 = poVar2;
    do {
      poVar31 = poVar31 + 1;
      uVar1 = poVar2[uVar37].cn;
      uVar34 = (ulong)uVar1;
      if ((uint)uVar1 < image->numcomps) {
        if (1 < (ushort)(poVar2[uVar37].asoc + 1)) {
          uVar33 = poVar2[uVar37].asoc - 1;
          if (image->numcomps <= (uint)uVar33) {
            fmt = "opj_jp2_apply_cdef: acn=%d, numcomps=%d\n";
            uVar34 = (ulong)(uint)uVar33;
            goto LAB_0011d3ac;
          }
          if ((uVar1 != uVar33) && (poVar2[uVar37].typ == 0)) {
            poVar3 = image->comps;
            poVar4 = poVar3 + uVar1;
            OVar26 = poVar4->dx;
            OVar27 = poVar4->dy;
            OVar28 = poVar4->w;
            OVar29 = poVar4->h;
            poVar4 = poVar3 + uVar1;
            OVar22 = poVar4->x0;
            OVar23 = poVar4->y0;
            uVar5 = *(undefined8 *)(&poVar4->x0 + 2);
            poVar4 = poVar3 + uVar1;
            OVar24 = poVar4->sgnd;
            OVar25 = poVar4->resno_decoded;
            uVar6 = *(undefined8 *)(&poVar4->sgnd + 2);
            pOVar7 = poVar3[uVar1].data;
            uVar8 = (&poVar3[uVar1].data)[1];
            poVar4 = poVar3 + uVar33;
            OVar15 = poVar4->dy;
            OVar16 = poVar4->w;
            OVar17 = poVar4->h;
            poVar13 = poVar3 + uVar33;
            OVar18 = poVar13->x0;
            OVar19 = poVar13->y0;
            uVar9 = *(undefined8 *)(&poVar13->x0 + 2);
            poVar13 = poVar3 + uVar33;
            OVar20 = poVar13->sgnd;
            OVar21 = poVar13->resno_decoded;
            uVar10 = *(undefined8 *)(&poVar13->sgnd + 2);
            pOVar11 = poVar3[uVar33].data;
            uVar12 = (&poVar3[uVar33].data)[1];
            poVar13 = poVar3 + uVar1;
            poVar13->dx = poVar4->dx;
            poVar13->dy = OVar15;
            poVar13->w = OVar16;
            poVar13->h = OVar17;
            poVar4 = poVar3 + uVar1;
            poVar4->x0 = OVar18;
            poVar4->y0 = OVar19;
            *(undefined8 *)(&poVar4->x0 + 2) = uVar9;
            poVar4 = poVar3 + uVar1;
            poVar4->sgnd = OVar20;
            poVar4->resno_decoded = OVar21;
            *(undefined8 *)(&poVar4->sgnd + 2) = uVar10;
            poVar3[uVar1].data = pOVar11;
            (&poVar3[uVar1].data)[1] = (OPJ_INT32 *)uVar12;
            poVar4 = image->comps;
            poVar13 = poVar4 + uVar33;
            poVar13->x0 = OVar22;
            poVar13->y0 = OVar23;
            *(undefined8 *)(&poVar13->x0 + 2) = uVar5;
            poVar13 = poVar4 + uVar33;
            poVar13->sgnd = OVar24;
            poVar13->resno_decoded = OVar25;
            *(undefined8 *)(&poVar13->sgnd + 2) = uVar6;
            poVar4[uVar33].data = pOVar7;
            (&poVar4[uVar33].data)[1] = (OPJ_INT32 *)uVar8;
            poVar4 = poVar4 + uVar33;
            poVar4->dx = OVar26;
            poVar4->dy = OVar27;
            poVar4->w = OVar28;
            poVar4->h = OVar29;
            poVar30 = poVar31;
            uVar34 = uVar36;
            uVar14 = uVar37 + 1;
            while (uVar14 < uVar32) {
              uVar35 = uVar33;
              if ((poVar30->cn == uVar1) || (uVar35 = uVar1, poVar30->cn == uVar33)) {
                poVar30->cn = uVar35;
              }
              poVar30 = poVar30 + 1;
              uVar34 = uVar34 + 1;
              uVar14 = uVar34;
            }
          }
        }
        image->comps[uVar1].alpha = poVar2[uVar37].typ;
      }
      else {
        fmt = "opj_jp2_apply_cdef: cn=%d, numcomps=%d\n";
LAB_0011d3ac:
        opj_event_msg(manager,2,fmt,uVar34);
      }
      uVar37 = uVar37 + 1;
      uVar36 = uVar36 + 1;
    } while (uVar37 != uVar32);
  }
  poVar2 = color->jp2_cdef->info;
  if (poVar2 != (opj_jp2_cdef_info_t *)0x0) {
    opj_free(poVar2);
  }
  opj_free(color->jp2_cdef);
  color->jp2_cdef = (opj_jp2_cdef_t *)0x0;
  return;
}

Assistant:

static void opj_jp2_apply_cdef(opj_image_t *image, opj_jp2_color_t *color,
                               opj_event_mgr_t *manager)
{
    opj_jp2_cdef_info_t *info;
    OPJ_UINT16 i, n, cn, asoc, acn;

    info = color->jp2_cdef->info;
    n = color->jp2_cdef->n;

    for (i = 0; i < n; ++i) {
        /* WATCH: acn = asoc - 1 ! */
        asoc = info[i].asoc;
        cn = info[i].cn;

        if (cn >= image->numcomps) {
            opj_event_msg(manager, EVT_WARNING, "opj_jp2_apply_cdef: cn=%d, numcomps=%d\n",
                          cn, image->numcomps);
            continue;
        }
        if (asoc == 0 || asoc == 65535) {
            image->comps[cn].alpha = info[i].typ;
            continue;
        }

        acn = (OPJ_UINT16)(asoc - 1);
        if (acn >= image->numcomps) {
            opj_event_msg(manager, EVT_WARNING, "opj_jp2_apply_cdef: acn=%d, numcomps=%d\n",
                          acn, image->numcomps);
            continue;
        }

        /* Swap only if color channel */
        if ((cn != acn) && (info[i].typ == 0)) {
            opj_image_comp_t saved;
            OPJ_UINT16 j;

            memcpy(&saved, &image->comps[cn], sizeof(opj_image_comp_t));
            memcpy(&image->comps[cn], &image->comps[acn], sizeof(opj_image_comp_t));
            memcpy(&image->comps[acn], &saved, sizeof(opj_image_comp_t));

            /* Swap channels in following channel definitions, don't bother with j <= i that are already processed */
            for (j = (OPJ_UINT16)(i + 1U); j < n ; ++j) {
                if (info[j].cn == cn) {
                    info[j].cn = acn;
                } else if (info[j].cn == acn) {
                    info[j].cn = cn;
                }
                /* asoc is related to color index. Do not update. */
            }
        }

        image->comps[cn].alpha = info[i].typ;
    }

    if (color->jp2_cdef->info) {
        opj_free(color->jp2_cdef->info);
    }

    opj_free(color->jp2_cdef);
    color->jp2_cdef = NULL;

}